

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_wait_for_sync(rtr_socket *rtr_socket)

{
  long lVar1;
  int iVar2;
  time_t in_RCX;
  int iVar3;
  size_t pdu_len;
  long in_FS_OFFSET;
  time_t cur_time;
  long lStack_10030;
  undefined1 uStack_10028;
  char cStack_10027;
  uint uStack_10020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_get_monotonic_time(&lStack_10030);
  pdu_len = ((ulong)rtr_socket->refresh_interval + rtr_socket->last_update) - lStack_10030;
  if ((long)pdu_len < 1) {
    pdu_len = 0;
  }
  lrtr_dbg("RTR Socket: waiting %jd sec. till next sync",pdu_len);
  iVar2 = rtr_receive_pdu(rtr_socket,&uStack_10028,pdu_len,in_RCX);
  iVar3 = -1;
  if (iVar2 < 0) {
    if (iVar2 == -2) {
      iVar3 = 0;
      lrtr_dbg("RTR Socket: Refresh interval expired");
    }
  }
  else if (cStack_10027 == '\0') {
    iVar3 = 0;
    lrtr_dbg("RTR Socket: Serial Notify received (%u)",(ulong)uStack_10020);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_wait_for_sync(struct rtr_socket *rtr_socket)
{
	char pdu[RTR_MAX_PDU_LEN];

	time_t cur_time;

	lrtr_get_monotonic_time(&cur_time);
	time_t wait = (rtr_socket->last_update + rtr_socket->refresh_interval) - cur_time;

	if (wait < 0)
		wait = 0;

	RTR_DBG("waiting %jd sec. till next sync", (intmax_t)wait);
	const int rtval = rtr_receive_pdu(rtr_socket, pdu, sizeof(pdu), wait);

	if (rtval >= 0) {
		enum pdu_type type = rtr_get_pdu_type(pdu);

		if (type == SERIAL_NOTIFY) {
			RTR_DBG("Serial Notify received (%u)", ((struct pdu_serial_notify *)pdu)->sn);
			return RTR_SUCCESS;
		}
	} else if (rtval == TR_WOULDBLOCK) {
		RTR_DBG1("Refresh interval expired");
		return RTR_SUCCESS;
	}
	return RTR_ERROR;
}